

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ostream * __thiscall
parser::ActionState::stringify(ActionState *this,ostream *out,NonTerminalNames *nonTerminalNames)

{
  ostream *poVar1;
  ParserError *this_00;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  string local_90;
  byte local_6d;
  byte local_5a;
  allocator<char> local_59;
  string local_58;
  undefined1 local_31;
  ParserError *local_30;
  NonTerminalNames *local_28;
  NonTerminalNames *nonTerminalNames_local;
  ostream *out_local;
  ActionState *this_local;
  
  local_28 = nonTerminalNames;
  nonTerminalNames_local = (NonTerminalNames *)out;
  out_local = (ostream *)this;
  poVar1 = std::operator<<(out,"[");
  local_31 = 0;
  local_5a = 0;
  local_6d = 0;
  if (this->action == Shift) {
    local_a8 = "S";
  }
  else {
    if (this->action == Reduce) {
      local_b0 = "R";
    }
    else {
      if (this->action == Accept) {
        local_b8 = "A";
      }
      else {
        if (this->action != Error) {
          this_00 = (ParserError *)__cxa_allocate_exception(0x10);
          local_31 = 1;
          local_30 = this_00;
          std::allocator<char>::allocator();
          local_5a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"invalid action",&local_59);
          local_6d = 1;
          ParserError::ParserError(this_00,&local_58);
          local_31 = 0;
          __cxa_throw(this_00,&ParserError::typeinfo,ParserError::~ParserError);
        }
        local_b8 = "E";
      }
      local_b0 = local_b8;
    }
    local_a8 = local_b0;
  }
  poVar1 = std::operator<<(poVar1,local_a8);
  poVar1 = std::operator<<(poVar1,", ");
  std::ostream::operator<<(poVar1,this->state);
  if ((local_6d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((local_5a & 1) != 0) {
    std::allocator<char>::~allocator(&local_59);
  }
  if (this->nonTerminal == 0) {
    this_local = (ActionState *)std::operator<<((ostream *)nonTerminalNames_local,"]");
  }
  else {
    poVar1 = std::operator<<((ostream *)nonTerminalNames_local,", ");
    nonTerminalName(&local_90,this->nonTerminal,local_28);
    poVar1 = std::operator<<(poVar1,(string *)&local_90);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->reduceCount);
    this_local = (ActionState *)std::operator<<(poVar1,"]");
    std::__cxx11::string::~string((string *)&local_90);
  }
  return (ostream *)this_local;
}

Assistant:

std::ostream& stringify(std::ostream& out, NonTerminalNames const& nonTerminalNames) const {
            out << "[" << (action == Shift ? "S" : action == Reduce ? "R" : action == Accept ? "A" : action == Error ? "E" : throw ParserError("invalid action"))
                << ", " << state;
            if (nonTerminal == Invalid)
                return out << "]";
            return out << ", "
                       << nonTerminalName(nonTerminal, nonTerminalNames) << ", "
                       << reduceCount  << "]";
        }